

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

int pnga_register_type(size_t bytes)

{
  int iVar1;
  long lVar2;
  
  iVar1 = 0x3f9;
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 0xef0) {
      return -1;
    }
    if (*(int *)((long)&ga_types[0x11].active + lVar2) != 1) break;
    lVar2 = lVar2 + 0x10;
    iVar1 = iVar1 + 1;
  }
  *(undefined4 *)((long)&ga_types[0x11].active + lVar2) = 1;
  *(size_t *)((long)&ga_types[0x11].size + lVar2) = bytes;
  return iVar1;
}

Assistant:

int pnga_register_type(size_t bytes) {
  int i;
  for(i=GA_TYPES_RESERVED; i<GA_TYPES_MAX && ga_types[i].active==1; i++);
  if(i==GA_TYPES_MAX) {
    return -1;
  }
  ga_types[i].active = 1;
  ga_types[i].size = bytes;
  return i+MT_BASE;
}